

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O0

BaseStatistics * duckdb::StructStats::GetChildStats(BaseStatistics *stats)

{
  StatisticsType SVar1;
  InternalException *this;
  pointer pBVar2;
  string *in_stack_ffffffffffffffa8;
  unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
  *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  SVar1 = BaseStatistics::GetStatsType((BaseStatistics *)0xb7b723);
  if (SVar1 != STRUCT_STATS) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Calling StructStats::GetChildStats on stats that is not a struct",&local_29
              );
    InternalException::InternalException(this,in_stack_ffffffffffffffa8);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  pBVar2 = ::std::
           unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>::get
                     (in_stack_ffffffffffffffb0);
  return pBVar2;
}

Assistant:

const BaseStatistics *StructStats::GetChildStats(const BaseStatistics &stats) {
	if (stats.GetStatsType() != StatisticsType::STRUCT_STATS) {
		throw InternalException("Calling StructStats::GetChildStats on stats that is not a struct");
	}
	return stats.child_stats.get();
}